

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::IsBindAny(CNetAddr *this)

{
  long lVar1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  long in_FS_OFFSET;
  CNetAddr *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsIPv4(in_stack_ffffffffffffffb8);
  if (!bVar2) {
    bVar2 = IsIPv6(in_stack_ffffffffffffffb8);
    if (!bVar2) {
      local_9 = false;
      goto LAB_00dfed56;
    }
  }
  cVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::begin
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  cVar4 = prevector<16U,_unsigned_char,_unsigned_int,_int>::end
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  local_9 = std::
            all_of<prevector<16u,unsigned_char,unsigned_int,int>::const_iterator,CNetAddr::IsBindAny()const::__0>
                      (cVar3.ptr,cVar4.ptr);
LAB_00dfed56:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsBindAny() const
{
    if (!IsIPv4() && !IsIPv6()) {
        return false;
    }
    return std::all_of(m_addr.begin(), m_addr.end(), [](uint8_t b) { return b == 0; });
}